

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineArguments_setExcludeStrictNameFilter_Test::
~TEST_CommandLineArguments_setExcludeStrictNameFilter_Test
          (TEST_CommandLineArguments_setExcludeStrictNameFilter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xsn", "name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}